

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_bitst.cc
# Opt level: O3

ASN1_BIT_STRING *
v2i_ASN1_BIT_STRING(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,stack_st_CONF_VALUE *nval)

{
  char *__s2;
  int iVar1;
  ASN1_BIT_STRING *a;
  size_t sVar2;
  undefined8 *puVar3;
  size_t sVar4;
  long *plVar5;
  char *__s1;
  
  a = ASN1_BIT_STRING_new();
  if (a == (ASN1_BIT_STRING *)0x0) {
LAB_0023f83d:
    a = (ASN1_BIT_STRING *)0x0;
  }
  else {
    sVar2 = OPENSSL_sk_num((OPENSSL_STACK *)nval);
    if (sVar2 != 0) {
      sVar2 = 0;
      do {
        puVar3 = (undefined8 *)OPENSSL_sk_value((OPENSSL_STACK *)nval,sVar2);
        __s1 = *(char **)((long)method->usr_data + 8);
        if (__s1 == (char *)0x0) {
LAB_0023f7e1:
          ERR_put_error(0x14,0,0x9c,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_bitst.cc"
                        ,0x54);
          ERR_add_error_data(6,"section:",*puVar3,",name:",puVar3[1],",value:",puVar3[2]);
LAB_0023f835:
          ASN1_BIT_STRING_free(a);
          goto LAB_0023f83d;
        }
        __s2 = (char *)puVar3[1];
        plVar5 = (long *)((long)method->usr_data + 0x20);
        while ((iVar1 = strcmp((char *)plVar5[-2],__s2), iVar1 != 0 &&
               (iVar1 = strcmp(__s1,__s2), iVar1 != 0))) {
          __s1 = (char *)*plVar5;
          plVar5 = plVar5 + 3;
          if (__s1 == (char *)0x0) goto LAB_0023f7e1;
        }
        iVar1 = ASN1_BIT_STRING_set_bit(a,(int)plVar5[-4],1);
        if (iVar1 == 0) goto LAB_0023f835;
        if (plVar5[-3] == 0) goto LAB_0023f7e1;
        sVar2 = sVar2 + 1;
        sVar4 = OPENSSL_sk_num((OPENSSL_STACK *)nval);
      } while (sVar2 < sVar4);
    }
  }
  return a;
}

Assistant:

static void *v2i_ASN1_BIT_STRING(const X509V3_EXT_METHOD *method,
                                 const X509V3_CTX *ctx,
                                 const STACK_OF(CONF_VALUE) *nval) {
  ASN1_BIT_STRING *bs;
  if (!(bs = ASN1_BIT_STRING_new())) {
    return NULL;
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(nval); i++) {
    const CONF_VALUE *val = sk_CONF_VALUE_value(nval, i);
    const BIT_STRING_BITNAME *bnam;
    for (bnam = reinterpret_cast<const BIT_STRING_BITNAME *>(method->usr_data);
         bnam->lname; bnam++) {
      if (!strcmp(bnam->sname, val->name) || !strcmp(bnam->lname, val->name)) {
        if (!ASN1_BIT_STRING_set_bit(bs, bnam->bitnum, 1)) {
          ASN1_BIT_STRING_free(bs);
          return NULL;
        }
        break;
      }
    }
    if (!bnam->lname) {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_UNKNOWN_BIT_STRING_ARGUMENT);
      X509V3_conf_err(val);
      ASN1_BIT_STRING_free(bs);
      return NULL;
    }
  }
  return bs;
}